

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O0

int __thiscall
zmq::thread_ctx_t::set(thread_ctx_t *this,int option_,void *optval_,size_t optvallen_)

{
  size_type sVar1;
  int *piVar2;
  ulong in_RCX;
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar3;
  scoped_lock_t locker_5;
  scoped_lock_t locker_4;
  ostringstream s;
  scoped_lock_t locker_3;
  scoped_lock_t locker_2;
  scoped_lock_t locker_1;
  scoped_lock_t locker;
  int value;
  bool is_int;
  mutex_t *in_stack_fffffffffffffda8;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffdb0;
  ostringstream *this_01;
  value_type_conflict4 *in_stack_fffffffffffffdc8;
  string local_218 [40];
  ostringstream local_1f0 [388];
  undefined4 local_6c;
  _Base_ptr local_60;
  undefined1 local_58;
  int local_30;
  undefined1 local_29;
  int *local_20;
  int local_4;
  
  local_29 = in_RCX == 4;
  local_30 = 0;
  if ((bool)local_29) {
    local_30 = *in_RDX;
  }
  this_00 = (set<int,_std::less<int>,_std::allocator<int>_> *)(ulong)(in_ESI - 3);
  switch(this_00) {
  case (set<int,_std::less<int>,_std::allocator<int>_> *)0x0:
    if (((bool)local_29) && (-1 < local_30)) {
      scoped_lock_t::scoped_lock_t
                ((scoped_lock_t *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      *(int *)(in_RDI + 0x30) = local_30;
      local_4 = 0;
      local_6c = 1;
      scoped_lock_t::~scoped_lock_t((scoped_lock_t *)0x2a6ca8);
      return local_4;
    }
    break;
  case (set<int,_std::less<int>,_std::allocator<int>_> *)0x1:
    if (((bool)local_29) && (-1 < local_30)) {
      scoped_lock_t::scoped_lock_t
                ((scoped_lock_t *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      *(int *)(in_RDI + 0x34) = local_30;
      local_4 = 0;
      scoped_lock_t::~scoped_lock_t((scoped_lock_t *)0x2a6aca);
      return local_4;
    }
    break;
  case (set<int,_std::less<int>,_std::allocator<int>_> *)0x4:
    if (((bool)local_29) && (-1 < local_30)) {
      scoped_lock_t::scoped_lock_t
                ((scoped_lock_t *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      pVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        (this_00,in_stack_fffffffffffffdc8);
      local_60 = (_Base_ptr)pVar3.first._M_node;
      local_58 = pVar3.second;
      local_4 = 0;
      scoped_lock_t::~scoped_lock_t((scoped_lock_t *)0x2a6b53);
      return local_4;
    }
    break;
  case (set<int,_std::less<int>,_std::allocator<int>_> *)0x5:
    if (((bool)local_29) && (-1 < local_30)) {
      scoped_lock_t::scoped_lock_t
                ((scoped_lock_t *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      sVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                        (in_stack_fffffffffffffdb0,(key_type_conflict1 *)in_stack_fffffffffffffda8);
      if (sVar1 == 0) {
        piVar2 = __errno_location();
        *piVar2 = 0x16;
        local_4 = -1;
      }
      else {
        local_4 = 0;
      }
      local_6c = 1;
      scoped_lock_t::~scoped_lock_t((scoped_lock_t *)0x2a6c46);
      return local_4;
    }
    break;
  case (set<int,_std::less<int>,_std::allocator<int>_> *)0x6:
    if ((bool)local_29) {
      this_01 = local_1f0;
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::ostream::operator<<(this_01,local_30);
      scoped_lock_t::scoped_lock_t((scoped_lock_t *)this_01,in_stack_fffffffffffffda8);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)(in_RDI + 0x68),local_218);
      std::__cxx11::string::~string(local_218);
      local_4 = 0;
      local_6c = 1;
      scoped_lock_t::~scoped_lock_t((scoped_lock_t *)0x2a6d41);
      std::__cxx11::ostringstream::~ostringstream(local_1f0);
      return local_4;
    }
    if ((in_RCX != 0) && (in_RCX < 0x11)) {
      local_20 = in_RDX;
      scoped_lock_t::scoped_lock_t
                ((scoped_lock_t *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      std::__cxx11::string::assign((char *)(in_RDI + 0x68),(ulong)local_20);
      local_4 = 0;
      local_6c = 1;
      scoped_lock_t::~scoped_lock_t((scoped_lock_t *)0x2a6df8);
      return local_4;
    }
  }
  piVar2 = __errno_location();
  *piVar2 = 0x16;
  return -1;
}

Assistant:

int zmq::thread_ctx_t::set (int option_, const void *optval_, size_t optvallen_)
{
    const bool is_int = (optvallen_ == sizeof (int));
    int value = 0;
    if (is_int)
        memcpy (&value, optval_, sizeof (int));

    switch (option_) {
        case ZMQ_THREAD_SCHED_POLICY:
            if (is_int && value >= 0) {
                scoped_lock_t locker (_opt_sync);
                _thread_sched_policy = value;
                return 0;
            }
            break;

        case ZMQ_THREAD_AFFINITY_CPU_ADD:
            if (is_int && value >= 0) {
                scoped_lock_t locker (_opt_sync);
                _thread_affinity_cpus.insert (value);
                return 0;
            }
            break;

        case ZMQ_THREAD_AFFINITY_CPU_REMOVE:
            if (is_int && value >= 0) {
                scoped_lock_t locker (_opt_sync);
                if (0 == _thread_affinity_cpus.erase (value)) {
                    errno = EINVAL;
                    return -1;
                }
                return 0;
            }
            break;

        case ZMQ_THREAD_PRIORITY:
            if (is_int && value >= 0) {
                scoped_lock_t locker (_opt_sync);
                _thread_priority = value;
                return 0;
            }
            break;

        case ZMQ_THREAD_NAME_PREFIX:
            // start_thread() allows max 16 chars for thread name
            if (is_int) {
                std::ostringstream s;
                s << value;
                scoped_lock_t locker (_opt_sync);
                _thread_name_prefix = s.str ();
                return 0;
            } else if (optvallen_ > 0 && optvallen_ <= 16) {
                scoped_lock_t locker (_opt_sync);
                _thread_name_prefix.assign (static_cast<const char *> (optval_),
                                            optvallen_);
                return 0;
            }
            break;
    }

    errno = EINVAL;
    return -1;
}